

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStore(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  
  if ((this->allowMemory == true) && ((type.id & 1) != 0 || type.id < 7)) {
    pEVar2 = makeNonAtomicStore(this,type);
    pEVar3 = (Expression *)0x0;
    if (pEVar2->_id == StoreId) {
      pEVar3 = pEVar2;
    }
    if ((((pEVar3 != (Expression *)0x0) &&
         (pEVar2 = pEVar3, (*(ulong *)(pEVar3[3].type.id + 8) & 0xfffffffffffffffe) == 2)) &&
        (((byte)this->wasm[0x178] & 1) != 0)) && (uVar1 = Random::upTo(&this->random,2), uVar1 != 0)
       ) {
      *(undefined1 *)(**(long **)(this->wasm + 0x78) + 0x48) = 1;
      *(undefined1 *)&pEVar3[2].type.id = 1;
      *(ulong *)(pEVar3 + 2) = (ulong)pEVar3[1]._id;
    }
    return pEVar2;
  }
  pEVar2 = makeTrivial(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeStore(Type type) {
  if (!allowMemory || type.isRef()) {
    return makeTrivial(type);
  }
  auto* ret = makeNonAtomicStore(type);
  auto* store = ret->dynCast<Store>();
  if (!store) {
    return ret;
  }
  if (store->value->type != Type::i32 && store->value->type != Type::i64) {
    return store;
  }
  if (!wasm.features.hasAtomics() || oneIn(2)) {
    return store;
  }
  // make it atomic
  wasm.memories[0]->shared = true;
  store->isAtomic = true;
  store->align = store->bytes;
  return store;
}